

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManFromIfGetConfig
               (Vec_Int_t *vConfigs,If_Man_t *pIfMan,If_Cut_t *pCutBest,int iLit,
               Vec_Str_t *vConfigsStr)

{
  If_DsdMan_t *p;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  word *pwVar12;
  char *pcVar13;
  word *p_00;
  If_Obj_t *pIVar14;
  int nIntNum;
  int nPermBitOne;
  int nPermBitNum;
  int nTtBitNum;
  int nVarNum;
  int Var;
  int Lit;
  int i;
  int v;
  word *pArray;
  char *pCutPerm;
  word *pPerm;
  If_Obj_t *pIfObj;
  Vec_Str_t *vConfigsStr_local;
  int iLit_local;
  If_Cut_t *pCutBest_local;
  If_Man_t *pIfMan_local;
  Vec_Int_t *vConfigs_local;
  
  p = pIfMan->pIfDsdMan;
  iVar2 = If_CutDsdLit(pIfMan,pCutBest);
  pwVar12 = If_DsdManGetFuncConfig(p,iVar2);
  pcVar13 = If_CutDsdPerm(pIfMan,pCutBest);
  iVar2 = If_DsdManVarNum(pIfMan->pIfDsdMan);
  iVar3 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
  iVar4 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
  iVar5 = iVar4 / iVar2;
  iVar6 = Vec_IntEntry(vConfigs,1);
  for (Var = 0; Var < iVar6; Var = Var + 1) {
    Vec_IntPush(vConfigs,0);
  }
  iVar7 = Vec_IntSize(vConfigs);
  p_00 = (word *)Vec_IntEntryP(vConfigs,iVar7 - iVar6);
  if (iVar4 % iVar2 == 0) {
    for (Var = 0; Var < iVar3; Var = Var + 1) {
      iVar7 = Abc_TtGetBit(pwVar12 + 1,Var);
      if (iVar7 != 0) {
        Abc_TtSetBit(p_00,Var);
      }
    }
    Lit = 0;
    while( true ) {
      if (iVar2 <= Lit) {
        if (iVar3 + iVar4 < iVar6 * 0x20) {
          iVar6 = If_CutDsdLit(pIfMan,pCutBest);
          uVar10 = Abc_LitIsCompl(iVar6);
          uVar8 = *(uint *)&pCutBest->field_0x1c;
          uVar11 = Abc_LitIsCompl(iLit);
          if ((uVar10 ^ uVar8 >> 0xc & 1) != uVar11) {
            Abc_TtSetBit(p_00,iVar3 + iVar4);
          }
          Vec_IntAddToEntry(vConfigs,0,1);
          if (vConfigsStr != (Vec_Str_t *)0x0) {
            uVar8 = Abc_Lit2Var(iLit);
            Vec_StrPrintF(vConfigsStr,"%d",(ulong)uVar8);
            Vec_StrPush(vConfigsStr,' ');
            for (Var = 0; Var < iVar3; Var = Var + 1) {
              iVar6 = Abc_TtGetBit(p_00,Var);
              cVar1 = '0';
              if (iVar6 != 0) {
                cVar1 = '1';
              }
              Vec_StrPush(vConfigsStr,cVar1);
            }
            Vec_StrPush(vConfigsStr,' ');
            Vec_StrPush(vConfigsStr,' ');
            for (Lit = 0; Lit < iVar2; Lit = Lit + 1) {
              for (Var = 0; Var < iVar5; Var = Var + 1) {
                iVar6 = Abc_TtGetBit(p_00,iVar3 + Lit * iVar5 + Var);
                cVar1 = '0';
                if (iVar6 != 0) {
                  cVar1 = '1';
                }
                Vec_StrPush(vConfigsStr,cVar1);
                if (Var == 0) {
                  Vec_StrPush(vConfigsStr,' ');
                }
              }
              Vec_StrPush(vConfigsStr,' ');
              Vec_StrPush(vConfigsStr,' ');
            }
            iVar2 = Abc_TtGetBit(p_00,iVar3 + iVar4);
            cVar1 = '0';
            if (iVar2 != 0) {
              cVar1 = '1';
            }
            Vec_StrPush(vConfigsStr,cVar1);
            Vec_StrPush(vConfigsStr,'\n');
          }
          return;
        }
        __assert_fail("nTtBitNum + nPermBitNum < 32 * nIntNum",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                      ,0x61f,
                      "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                     );
      }
      uVar8 = (uint)(*pwVar12 >> ((byte)(Lit << 2) & 0x3f)) & 0xf;
      if (*(uint *)&pCutBest->field_0x1c >> 0x18 <= uVar8) break;
      iVar7 = (int)pcVar13[(int)uVar8];
      iVar9 = Abc_Lit2Var(iVar7);
      if ((int)(*(uint *)&pCutBest->field_0x1c >> 0x18) <= iVar9) {
        __assert_fail("Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                      ,0x615,
                      "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                     );
      }
      iVar9 = Abc_Lit2Var(iVar7);
      pIVar14 = If_ManObj(pIfMan,(int)(&pCutBest[1].Area)[iVar9]);
      iVar9 = Abc_LitIsCompl((pIVar14->field_22).iCopy);
      iVar7 = Abc_LitNotCond(iVar7,iVar9);
      for (Var = 0; Var < iVar5; Var = Var + 1) {
        if ((iVar7 >> ((byte)Var & 0x1f) & 1U) != 0) {
          Abc_TtSetBit(p_00,iVar3 + Lit * iVar5 + Var);
        }
      }
      Lit = Lit + 1;
    }
    __assert_fail("Var < (int)pCutBest->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x612,
                  "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                 );
  }
  __assert_fail("nPermBitNum % nVarNum == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                ,0x608,
                "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
               );
}

Assistant:

void Gia_ManFromIfGetConfig( Vec_Int_t * vConfigs, If_Man_t * pIfMan, If_Cut_t * pCutBest, int iLit, Vec_Str_t * vConfigsStr )
{
    If_Obj_t * pIfObj = NULL;
    word * pPerm = If_DsdManGetFuncConfig( pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest) ); // cell input -> DSD input
    char * pCutPerm = If_CutDsdPerm( pIfMan, pCutBest ); // DSD input -> cut input
    word * pArray;  int v, i, Lit, Var;
    int nVarNum = If_DsdManVarNum(pIfMan->pIfDsdMan);
    int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    int nPermBitOne = nPermBitNum / nVarNum;
    // prepare storage
    int nIntNum = Vec_IntEntry( vConfigs, 1 );
    for ( i = 0; i < nIntNum; i++ )
        Vec_IntPush( vConfigs, 0 );
    pArray = (word *)Vec_IntEntryP( vConfigs, Vec_IntSize(vConfigs) - nIntNum );
    assert( nPermBitNum % nVarNum == 0 );
    // set truth table bits
    for ( i = 0; i < nTtBitNum; i++ )
        if ( Abc_TtGetBit(pPerm + 1, i) )
            Abc_TtSetBit( pArray, i );
    // set permutation bits
    for ( v = 0; v < nVarNum; v++ )
    {
        // get DSD variable
        Var = ((pPerm[0] >> (v * 4)) & 0xF);
        assert( Var < (int)pCutBest->nLeaves );
        // get AIG literal
        Lit = (int)pCutPerm[Var];
        assert( Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves );
        // complement if polarity has changed
        pIfObj = If_ManObj( pIfMan, pCutBest->pLeaves[Abc_Lit2Var(Lit)] );
        Lit = Abc_LitNotCond( Lit, Abc_LitIsCompl(pIfObj->iCopy) );
        // create config literal
        for ( i = 0; i < nPermBitOne; i++ )
            if ( (Lit >> i) & 1 )
                Abc_TtSetBit( pArray, nTtBitNum + v * nPermBitOne + i );
    }
    // remember complementation
    assert( nTtBitNum + nPermBitNum < 32 * nIntNum );
    if ( Abc_LitIsCompl(If_CutDsdLit(pIfMan, pCutBest)) ^ pCutBest->fCompl ^ Abc_LitIsCompl(iLit) )
        Abc_TtSetBit( pArray, nTtBitNum + nPermBitNum );
    // update count
    Vec_IntAddToEntry( vConfigs, 0, 1 );
    // write configs
    if ( vConfigsStr )
    {
        Vec_StrPrintF( vConfigsStr, "%d", Abc_Lit2Var(iLit) );
        Vec_StrPush( vConfigsStr, ' ' );
        for ( i = 0; i < nTtBitNum; i++ )
            Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, i) ? '1' : '0') );
        Vec_StrPush( vConfigsStr, ' ' );
        Vec_StrPush( vConfigsStr, ' ' );
        for ( v = 0; v < nVarNum; v++ )
        {
            for ( i = 0; i < nPermBitOne; i++ )
            {
                Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, nTtBitNum + v * nPermBitOne + i) ? '1' : '0') );
                if ( i == 0 ) 
                    Vec_StrPush( vConfigsStr, ' ' );
            }
            Vec_StrPush( vConfigsStr, ' ' );
            Vec_StrPush( vConfigsStr, ' ' );
        }
        Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, nTtBitNum + nPermBitNum) ? '1' : '0') );
        Vec_StrPush( vConfigsStr, '\n' );
    }
}